

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::write_int<fmt::v10::appender,unsigned_long,char>
                   (appender out,unsigned_long value,uint prefix,format_specs<char> *specs,
                   digit_grouping<char> *grouping)

{
  presentation_type pVar1;
  int iVar2;
  char *digits;
  byte *pbVar3;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  char cVar11;
  unsigned_long uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  format_decimal_result<char_*> fVar17;
  char buffer_1 [20];
  memory_buffer buffer;
  uint local_29c;
  anon_class_24_3_e2c60416 local_298;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined1 local_258;
  undefined **local_248;
  undefined1 *local_240;
  ulong local_238;
  undefined8 local_230;
  undefined1 local_228 [504];
  
  local_238 = 0;
  local_248 = &PTR_grow_001b1210;
  local_230 = 500;
  pVar1 = specs->type;
  local_29c = prefix;
  local_240 = local_228;
  switch(pVar1) {
  case none:
  case dec:
    lVar7 = 0x3f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    uVar13 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar7] -
             (uint)(value < *(ulong *)(do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                                      (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar7]
                                      * 8));
    uVar14 = (ulong)uVar13;
    local_298.prefix = (uint *)0x0;
    local_298.grouping._0_6_ = 0;
    local_298.grouping._6_2_ = 0;
    local_298.buffer._0_4_ = 0;
    fVar17 = format_decimal<char,unsigned_long>((char *)&local_298,value,uVar13);
    copy_str_noinline<char,char*,fmt::v10::appender>
              ((char *)&local_298,fVar17.end,(appender)&local_248);
    uVar13 = local_29c;
    break;
  case oct:
    pbVar3 = (byte *)((long)&local_230 + 7);
    lVar7 = -1;
    uVar12 = value;
    uVar14 = 0;
    do {
      uVar15 = uVar14;
      lVar6 = lVar7;
      pbVar3 = pbVar3 + 1;
      lVar7 = lVar6 + 1;
      uVar14 = uVar15 + 1;
      bVar16 = 7 < uVar12;
      uVar12 = uVar12 >> 3;
    } while (bVar16);
    if ((((specs->field_0x9 & 0x80) != 0) && (value != 0)) && (specs->precision <= (int)uVar14)) {
      uVar13 = 0x3000;
      if (prefix == 0) {
        uVar13 = 0x30;
      }
      local_29c = (uVar13 | prefix) + 0x1000000;
    }
    uVar13 = local_29c;
    if ((uint)lVar7 < 500) {
      do {
        *pbVar3 = (byte)value & 7 | 0x30;
        pbVar3 = pbVar3 + -1;
        bVar16 = 7 < value;
        value = value >> 3;
        local_238 = uVar14;
      } while (bVar16);
    }
    else {
      pbVar3 = (byte *)((long)&local_298.prefix + lVar6 + 1);
      local_298.prefix = (uint *)0x0;
      local_298.grouping._0_6_ = 0;
      local_298.grouping._6_2_ = 0;
      local_298.buffer._0_4_ = 0;
      local_298.buffer._4_2_ = 0;
      do {
        *pbVar3 = (byte)value & 7 | 0x30;
        pbVar3 = pbVar3 + -1;
        bVar16 = 7 < value;
        value = value >> 3;
      } while (bVar16);
      copy_str_noinline<char,char*,fmt::v10::appender>
                ((char *)&local_298,(char *)((long)&local_298.prefix + uVar15 + 1),
                 (appender)&local_248);
    }
    break;
  case hex_lower:
  case hex_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar5 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar13 = uVar5 << 8;
      if (prefix == 0) {
        uVar13 = uVar5;
      }
      local_29c = (uVar13 | prefix) + 0x2000000;
    }
    uVar13 = local_29c;
    pcVar8 = (char *)((long)&local_230 + 7);
    lVar7 = -1;
    uVar12 = value;
    uVar14 = 0;
    do {
      uVar15 = uVar14;
      lVar6 = lVar7;
      pcVar8 = pcVar8 + 1;
      lVar7 = lVar6 + 1;
      uVar14 = uVar15 + 1;
      bVar16 = 0xf < uVar12;
      uVar12 = uVar12 >> 4;
    } while (bVar16);
    if ((uint)lVar7 < 500) {
      pcVar9 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar9 = "0123456789ABCDEF";
      }
      do {
        *pcVar8 = pcVar9[(uint)value & 0xf];
        pcVar8 = pcVar8 + -1;
        bVar16 = 0xf < value;
        value = value >> 4;
        local_238 = uVar14;
      } while (bVar16);
    }
    else {
      pcVar8 = (char *)((long)&local_298.prefix + lVar6 + 1);
      local_298.prefix = (uint *)0x0;
      local_298.grouping._0_6_ = 0;
      local_298.grouping._6_2_ = 0;
      local_298.buffer._0_4_ = (uint)local_298.buffer & 0xffffff00;
      pcVar9 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar9 = "0123456789ABCDEF";
      }
      do {
        *pcVar8 = pcVar9[(uint)value & 0xf];
        pcVar8 = pcVar8 + -1;
        bVar16 = 0xf < value;
        value = value >> 4;
      } while (bVar16);
      copy_str_noinline<char,char*,fmt::v10::appender>
                ((char *)&local_298,(char *)((long)&local_298.prefix + uVar15 + 1),
                 (appender)&local_248);
    }
    break;
  case bin_lower:
  case bin_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar5 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar13 = uVar5 << 8;
      if (prefix == 0) {
        uVar13 = uVar5;
      }
      local_29c = (uVar13 | prefix) + 0x2000000;
    }
    uVar13 = local_29c;
    pbVar3 = (byte *)((long)&local_230 + 7);
    lVar7 = -1;
    uVar12 = value;
    uVar14 = 0;
    do {
      uVar15 = uVar14;
      lVar6 = lVar7;
      pbVar3 = pbVar3 + 1;
      lVar7 = lVar6 + 1;
      uVar14 = uVar15 + 1;
      bVar16 = 1 < uVar12;
      uVar12 = uVar12 >> 1;
    } while (bVar16);
    if ((uint)lVar7 < 500) {
      do {
        *pbVar3 = (byte)value & 1 | 0x30;
        pbVar3 = pbVar3 + -1;
        bVar16 = 1 < value;
        value = value >> 1;
        local_238 = uVar14;
      } while (bVar16);
    }
    else {
      pbVar3 = (byte *)((long)&local_298.prefix + lVar6 + 1);
      local_268 = 0;
      uStack_260 = 0;
      local_278 = 0;
      uStack_270 = 0;
      local_298.buffer._0_4_ = 0;
      local_298.buffer._4_2_ = 0;
      local_298.buffer._6_2_ = 0;
      uStack_280 = 0;
      local_298.prefix = (uint *)0x0;
      local_298.grouping._0_6_ = 0;
      local_298.grouping._6_2_ = 0;
      local_258 = 0;
      do {
        *pbVar3 = (byte)value & 1 | 0x30;
        pbVar3 = pbVar3 + -1;
        bVar16 = 1 < value;
        value = value >> 1;
      } while (bVar16);
      copy_str_noinline<char,char*,fmt::v10::appender>
                ((char *)&local_298,(char *)((long)&local_298.prefix + uVar15 + 1),
                 (appender)&local_248);
    }
    break;
  default:
    throw_format_error("invalid format specifier");
  case chr:
    local_298.prefix = (uint *)((ulong)CONCAT61(local_298.prefix._2_6_,(char)value) << 8);
    bVar4.container =
         (buffer<char> *)
         write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write_char<char,fmt::v10::appender>(fmt::v10::appender,char,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_&>
                   (out,specs,1,1,(anon_class_2_2_bf5026b7 *)&local_298);
    goto LAB_00155f27;
  }
  if ((grouping->thousands_sep_)._M_string_length != 0) {
    pcVar8 = (grouping->grouping_)._M_dataplus._M_p;
    pcVar9 = pcVar8 + (grouping->grouping_)._M_string_length;
    iVar2 = 0;
    iVar10 = 0;
    do {
      if (pcVar8 == pcVar9) {
        cVar11 = pcVar9[-1];
        pcVar8 = pcVar9;
      }
      else {
        cVar11 = *pcVar8;
        if ((byte)(cVar11 + 0x81U) < 0x82) goto LAB_00155ef3;
        pcVar8 = pcVar8 + 1;
      }
      iVar10 = iVar10 + cVar11;
      if ((int)uVar14 <= iVar10) goto LAB_00155ef3;
      iVar2 = iVar2 + 1;
    } while( true );
  }
  iVar2 = 0;
LAB_00155ef3:
  uVar14 = (ulong)((int)uVar14 + iVar2 + (uVar13 >> 0x18));
  local_298.prefix = &local_29c;
  local_298.grouping._0_6_ = SUB86(grouping,0);
  local_298.grouping._6_2_ = (undefined2)((ulong)grouping >> 0x30);
  local_298.buffer._0_4_ = (uint)&local_248;
  local_298.buffer._4_2_ = (undefined2)((ulong)&local_248 >> 0x20);
  local_298.buffer._6_2_ = (undefined2)((ulong)&local_248 >> 0x30);
  bVar4.container =
       (buffer<char> *)
       write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,unsigned_long,char>(fmt::v10::appender,unsigned_long,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::digit_grouping<char>const&)::_lambda(fmt::v10::appender)_1_>
                 (out,specs,uVar14,uVar14,&local_298);
LAB_00155f27:
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar4.container;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs<Char>& specs,
               const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type) {
  case presentation_type::none:
  case presentation_type::dec: {
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::hex_lower:
  case presentation_type::hex_upper: {
    bool upper = specs.type == presentation_type::hex_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_uint<4, char>(appender(buffer), value, num_digits, upper);
    break;
  }
  case presentation_type::bin_lower:
  case presentation_type::bin_upper: {
    bool upper = specs.type == presentation_type::bin_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_uint<1, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::oct: {
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_uint<3, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::chr:
    return write_char(out, static_cast<Char>(value), specs);
  default:
    throw_format_error("invalid format specifier");
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}